

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O1

void insert_SNode_internal(Parser *p,SNode *sn)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  SNode **ppSVar6;
  SNode *pSVar7;
  uint uVar8;
  SNode **__s;
  size_t __size;
  ulong uVar9;
  
  iVar2 = *(int *)&sn->state;
  iVar3 = *(int *)&p->t->state;
  iVar4 = *(int *)&sn->initial_scope;
  uVar5 = (p->snode_hash).m;
  if (uVar5 < (p->snode_hash).n + 1) {
    ppSVar6 = (p->snode_hash).v;
    uVar8 = (p->snode_hash).i + 1;
    (p->snode_hash).i = uVar8;
    uVar8 = d_prime2[uVar8];
    (p->snode_hash).m = uVar8;
    __size = (ulong)uVar8 << 3;
    __s = (SNode **)malloc(__size);
    (p->snode_hash).v = __s;
    memset(__s,0,__size);
    if ((ulong)uVar5 != 0) {
      uVar9 = 0;
      do {
        while (pSVar7 = ppSVar6[uVar9], pSVar7 != (SNode *)0x0) {
          ppSVar6[uVar9] = pSVar7->bucket_next;
          insert_SNode_internal(p,pSVar7);
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 != uVar5);
    }
    free(ppSVar6);
  }
  ppSVar6 = (p->snode_hash).v;
  uVar9 = (ulong)(((uint)(iVar2 - iVar3) >> 3) * -0x11111000 + iVar4) % (ulong)(p->snode_hash).m;
  pSVar7 = ppSVar6[uVar9];
  sn->bucket_next = pSVar7;
  if (pSVar7 != sn) {
    ppSVar6[uVar9] = sn;
    puVar1 = &(p->snode_hash).n;
    *puVar1 = *puVar1 + 1;
    return;
  }
  __assert_fail("sn->bucket_next != sn",
                "/workspace/llm4binary/github/license_c_cmakelists/jplevyak[P]dparser/parse.c",0xb2,
                "void insert_SNode_internal(Parser *, SNode *)");
}

Assistant:

void insert_SNode_internal(Parser *p, SNode *sn) {
  SNodeHash *ph = &p->snode_hash;
  uint h = SNODE_HASH(sn->state - p->t->state, sn->initial_scope), i;
  SNode *t;

  if (ph->n + 1 > ph->m) {
    SNode **v = ph->v;
    uint m = ph->m;
    ph->i++;
    ph->m = d_prime2[ph->i];
    ph->v = (SNode **)MALLOC(ph->m * sizeof(*ph->v));
    memset(ph->v, 0, ph->m * sizeof(*ph->v));
    for (i = 0; i < m; i++)
      while ((t = v[i])) {
        v[i] = v[i]->bucket_next;
        insert_SNode_internal(p, t);
      }
    FREE(v);
  }
  sn->bucket_next = ph->v[h % ph->m];
  assert(sn->bucket_next != sn);
  ph->v[h % ph->m] = sn;
  ph->n++;
}